

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-c.cpp
# Opt level: O0

duckdb_data_chunk duckdb_stream_fetch_chunk(duckdb_result result)

{
  duckdb_result result_00;
  pointer pQVar1;
  long in_stack_00000030;
  DuckDBResultData *result_data;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
  *in_stack_ffffffffffffff90;
  undefined1 local_40 [16];
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  void *in_stack_fffffffffffffff8;
  duckdb_data_chunk p_Var2;
  
  if (in_stack_00000030 == 0) {
    p_Var2 = (duckdb_data_chunk)0x0;
  }
  else {
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->(in_stack_ffffffffffffff90);
    if ((pQVar1->super_BaseQueryResult).type == STREAM_RESULT) {
      memcpy(local_40,&stack0x00000008,0x30);
      result_00.deprecated_row_count = in_stack_ffffffffffffffd8;
      result_00.deprecated_column_count = in_stack_ffffffffffffffd0;
      result_00.deprecated_rows_changed = in_stack_ffffffffffffffe0;
      result_00.deprecated_columns = (duckdb_column *)in_stack_ffffffffffffffe8;
      result_00.deprecated_error_message = (char *)in_stack_00000030;
      result_00.internal_data = in_stack_fffffffffffffff8;
      p_Var2 = duckdb_fetch_chunk(result_00);
    }
    else {
      p_Var2 = (duckdb_data_chunk)0x0;
    }
  }
  return p_Var2;
}

Assistant:

duckdb_data_chunk duckdb_stream_fetch_chunk(duckdb_result result) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *((duckdb::DuckDBResultData *)result.internal_data);
	if (result_data.result->type != duckdb::QueryResultType::STREAM_RESULT) {
		// We can only fetch from a StreamQueryResult
		return nullptr;
	}
	return duckdb_fetch_chunk(result);
}